

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QString * tabTextFor(QMdiSubWindow *subWindow)

{
  bool bVar1;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QLatin1StringView QVar3;
  QString title;
  QWidget *this;
  QWidget *in_stack_ffffffffffffff98;
  QLatin1String *local_58;
  QWidget *widget;
  QString *in_stack_ffffffffffffffc8;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    QString::QString((QString *)0x60f9f9);
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    this = in_RDI;
    widget = in_RDI;
    QWidget::windowTitle(in_stack_ffffffffffffff98);
    bVar1 = QWidget::isWindowModified((QWidget *)0x60fa3b);
    if (bVar1) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffff98,(size_t)this);
      QVar3 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffff98,(size_t)this);
      in_stack_ffffffffffffff98 = (QWidget *)QVar3.m_size;
      local_58 = (QLatin1String *)QVar2.m_size;
      QString::replace((QLatin1String *)&local_20,local_58,(CaseSensitivity)QVar2.m_data);
    }
    else {
      qt_setWindowTitle_helperHelper(in_stack_ffffffffffffffc8,widget);
      QString::operator=((QString *)this,(QString *)in_RDI);
      QString::~QString((QString *)0x60faca);
    }
    bVar1 = QString::isEmpty((QString *)0x60fad4);
    if (bVar1) {
      QMdiArea::tr((char *)in_stack_ffffffffffffff98,(char *)this,(int)((ulong)in_RDI >> 0x20));
      in_RDI = this;
    }
    else {
      QString::QString((QString *)this,(QString *)in_RDI);
      in_RDI = this;
    }
    QString::~QString((QString *)0x60fb0d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QString tabTextFor(QMdiSubWindow *subWindow)
{
    if (!subWindow)
        return QString();

    QString title = subWindow->windowTitle();
    if (subWindow->isWindowModified()) {
        title.replace("[*]"_L1, "*"_L1);
    } else {
        extern QString qt_setWindowTitle_helperHelper(const QString&, const QWidget*);
        title = qt_setWindowTitle_helperHelper(title, subWindow);
    }

    return title.isEmpty() ? QMdiArea::tr("(Untitled)") : title;
}